

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O0

void anon_unknown.dwarf_1421bc::Fshifter_getParami(EffectProps *props,ALenum param,int *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  if (in_ESI == 2) {
    *in_RDX = *(undefined4 *)(in_RDI + 4);
  }
  else {
    if (in_ESI != 3) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid frequency shifter integer property 0x%04x",(ulong)in_ESI);
      __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDX = *(undefined4 *)(in_RDI + 8);
  }
  return;
}

Assistant:

void Fshifter_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_LEFT_DIRECTION:
        *val = props->Fshifter.LeftDirection;
        break;
    case AL_FREQUENCY_SHIFTER_RIGHT_DIRECTION:
        *val = props->Fshifter.RightDirection;
        break;
    default:
        throw effect_exception{AL_INVALID_ENUM,
            "Invalid frequency shifter integer property 0x%04x", param};
    }
}